

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O2

void __thiscall fe::PixelDISTANCE::getPixel(PixelDISTANCE *this,uchar *data,Pixel *p,int x,int y)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  
  fVar1 = *(float *)data;
  fVar2 = *(float *)(data + 4);
  uVar6 = (uint)((fVar1 - fVar2) * 10.0);
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  if (0xfe < uVar5) {
    uVar5 = 0xff;
  }
  bVar3 = (byte)uVar5 ^ 0xff;
  if (0.0 < fVar1) {
    (p->field_0).field_0.bytes[0] = bVar3;
    *(undefined2 *)((long)&p->field_0 + 1) = 0;
  }
  if (fVar1 < 0.0) {
    (p->field_0).field_0.bytes[0] = '\0';
    (p->field_0).field_0.bytes[1] = bVar3;
    (p->field_0).field_0.bytes[2] = '\0';
  }
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    uVar4 = (uchar)(int)(255.0 - fVar2 * 255.0);
    (p->field_0).field_0.bytes[0] = uVar4;
    (p->field_0).field_0.bytes[1] = uVar4;
    (p->field_0).field_0.bytes[2] = uVar4;
  }
  (p->field_0).field_0.bytes[3] = 0xff;
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
        {
            float d1 = *(float*)data;
            float d2 = *((float*)data + 1);
            int t = int((d1 - d2) * 10);
            int f = t;
            if (f < 0)
                f = -f;
            if (f > 255)
                f = 255;
            int color = 255 - f;

            if (d1 > 0)
            {
                p.r = color;
                p.g = 0;
                p.b = 0;
            }
            if (d1 < 0)
            {
                p.r = 0;
                p.g = color;
                p.b = 0;
            }

            if (d1 == 0)
            {
                color = int(255 - d2 * 255);
                p.r = color;
                p.g = color;
                p.b = color;
            }
            p.a = 255;
        }